

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

Var __thiscall
Js::DynamicTypeHandler::GetInlineSlot(DynamicTypeHandler *this,DynamicObject *instance,int index)

{
  _func_int **ptr;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  uVar3 = (uint)(this->offsetOfInlineSlots >> 3);
  if (index < (int)uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x67,"(index >= (int)(offsetOfInlineSlots / sizeof(Var)))",
                                "index should be relative to the address of the object");
    if (!bVar2) goto LAB_00e4bd19;
    *puVar4 = 0;
    uVar3 = (uint)(this->offsetOfInlineSlots >> 3);
  }
  if ((int)(uint)this->inlineSlotCapacity <= (int)(index - uVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x68,
                                "(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity())"
                                ,
                                "index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity()"
                               );
    if (!bVar2) goto LAB_00e4bd19;
    *puVar4 = 0;
  }
  ptr = (&(instance->super_RecyclableObject).super_FinalizableObject)[index].
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    bVar2 = ThreadContext::IsOnStack(ptr);
    if (bVar2) {
      bVar2 = VarIs<Js::RecyclableObject>(ptr);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                    ,0x6b,
                                    "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                    ,
                                    "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                                   );
        if (!bVar2) {
LAB_00e4bd19:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  return ptr;
}

Assistant:

Var DynamicTypeHandler::GetInlineSlot(DynamicObject * instance, int index)
    {
        AssertMsg(index >= (int)(offsetOfInlineSlots / sizeof(Var)), "index should be relative to the address of the object");
        Assert(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity());
        Var * slots = reinterpret_cast<Var*>(instance);
        Var value = slots[index];
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        return value;
    }